

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

int __thiscall
icu_63::TimeZoneFormat::clone
          (TimeZoneFormat *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  TimeZoneFormat *this_00;
  
  this_00 = (TimeZoneFormat *)UMemory::operator_new((UMemory *)0x530,(size_t)__fn);
  if (this_00 != (TimeZoneFormat *)0x0) {
    TimeZoneFormat(this_00,this);
  }
  return (int)this_00;
}

Assistant:

Format*
TimeZoneFormat::clone() const {
    return new TimeZoneFormat(*this);
}